

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::WritePointLight(ColladaExporter *this,aiLight *light)

{
  undefined1 *puVar1;
  ostream *poVar2;
  
  puVar1 = &this->field_0x38;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<point>",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<color sid=\"color\">",0x13);
  poVar2 = std::ostream::_M_insert<double>((double)(light->mColorDiffuse).r);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>((double)(light->mColorDiffuse).g);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>((double)(light->mColorDiffuse).b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</color>",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<constant_attenuation>",0x16);
  poVar2 = std::ostream::_M_insert<double>((double)light->mAttenuationConstant);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</constant_attenuation>",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<linear_attenuation>",0x14);
  poVar2 = std::ostream::_M_insert<double>((double)light->mAttenuationLinear);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</linear_attenuation>",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<quadratic_attenuation>",0x17);
  poVar2 = std::ostream::_M_insert<double>((double)light->mAttenuationQuadratic);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</quadratic_attenuation>",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  PopTag(this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</point>",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  return;
}

Assistant:

void ColladaExporter::WritePointLight(const aiLight *const light){
    const aiColor3D &color=  light->mColorDiffuse;
    mOutput << startstr << "<point>" << endstr;
    PushTag();
    mOutput << startstr << "<color sid=\"color\">"
                            << color.r<<" "<<color.g<<" "<<color.b
                        <<"</color>" << endstr;
    mOutput << startstr << "<constant_attenuation>"
                            << light->mAttenuationConstant
                        <<"</constant_attenuation>" << endstr;
    mOutput << startstr << "<linear_attenuation>"
                            << light->mAttenuationLinear
                        <<"</linear_attenuation>" << endstr;
    mOutput << startstr << "<quadratic_attenuation>"
                            << light->mAttenuationQuadratic
                        <<"</quadratic_attenuation>" << endstr;

    PopTag();
    mOutput << startstr << "</point>" << endstr;

}